

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O2

double ** HTS_alloc_matrix(size_t x,size_t y)

{
  double **ppdVar1;
  double *pdVar2;
  size_t sVar3;
  
  if (y == 0 || x == 0) {
    ppdVar1 = (double **)0x0;
  }
  else {
    ppdVar1 = (double **)HTS_calloc(x,8);
    for (sVar3 = 0; x != sVar3; sVar3 = sVar3 + 1) {
      pdVar2 = (double *)HTS_calloc(y,8);
      ppdVar1[sVar3] = pdVar2;
    }
  }
  return ppdVar1;
}

Assistant:

double **HTS_alloc_matrix(size_t x, size_t y)
{
   size_t i;
   double **p;

   if (x == 0 || y == 0)
      return NULL;

   p = (double **) HTS_calloc(x, sizeof(double *));

   for (i = 0; i < x; i++)
      p[i] = (double *) HTS_calloc(y, sizeof(double));
   return p;
}